

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.h
# Opt level: O0

void __thiscall xLearn::FMScore::~FMScore(FMScore *this)

{
  Score::~Score((Score *)0x1ad7ae);
  return;
}

Assistant:

~FMScore() { }